

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall IMLE<1,_1,_FastLinearExpert>::EM(IMLE<1,_1,_FastLinearExpert> *this,Z *z,X *x)

{
  bool bVar1;
  size_type sVar2;
  ostream *this_00;
  pointer pFVar3;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *this_01;
  DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *this_02;
  ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *in_RSI;
  ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
  *in_RDI;
  Scal SVar4;
  double __x;
  double __x_00;
  Scalar SVar5;
  double dVar6;
  Scalar SVar7;
  Scal tmp;
  iterator it_3;
  X sum_diagPsi;
  Z sum_diagSigma;
  iterator it_2;
  iterator it_1;
  iterator it;
  Scal sum_h;
  Scal h;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffaa8;
  vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
  *in_stack_fffffffffffffab0;
  value_type *in_stack_fffffffffffffab8;
  double dVar8;
  vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
  *in_stack_fffffffffffffac0;
  MatrixBase<Eigen::Diagonal<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>_> *in_stack_fffffffffffffac8;
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_1,_0,_1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
  *in_stack_fffffffffffffad0;
  pointer in_stack_fffffffffffffad8;
  ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *in_stack_fffffffffffffae0;
  StorageBaseType *in_stack_fffffffffffffaf0;
  ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> local_4c0 [168];
  NestedExpressionType local_418;
  double local_410;
  NestedExpressionType local_408;
  NestedExpressionType local_400;
  NestedExpressionType local_3f8;
  double local_3f0;
  Scal in_stack_fffffffffffffc18;
  X *in_stack_fffffffffffffc20;
  Z *in_stack_fffffffffffffc28;
  FastLinearExpert<1,_1> *in_stack_fffffffffffffc30;
  IMLE<1,_1,_FastLinearExpert> *in_stack_fffffffffffffc98;
  X *in_stack_fffffffffffffca0;
  Z *in_stack_fffffffffffffca8;
  FastLinearExpert<1,_1> *in_stack_fffffffffffffcb0;
  ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> local_340 [168];
  NestedExpressionType local_298;
  double local_290;
  double local_288;
  double local_258;
  FastLinearExpert<1,_1> *local_250;
  FastLinearExpert<1,_1> *local_238;
  __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
  local_230 [3];
  FastLinearExpert<1,_1> *local_218;
  FastLinearExpert<1,_1> *local_210;
  __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
  local_208;
  FastLinearExpert<1,_1> *local_200;
  FastLinearExpert<1,_1> *local_1f8;
  __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
  local_1f0 [26];
  FastLinearExpert<1,_1> *in_stack_fffffffffffffee0;
  __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
  local_30;
  double local_28;
  double local_20;
  ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *local_10;
  
  local_28 = 0.0;
  local_10 = in_RSI;
  local_30._M_current =
       (FastLinearExpert<1,_1> *)
       std::
       vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
       ::begin((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                *)in_stack_fffffffffffffaa8);
  while( true ) {
    std::
    vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>::
    end((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
         *)in_stack_fffffffffffffaa8);
    bVar1 = __gnu_cxx::operator<
                      ((__normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
                        *)in_stack_fffffffffffffab0,
                       (__normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
                        *)in_stack_fffffffffffffaa8);
    if (!bVar1) break;
    pFVar3 = __gnu_cxx::
             __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
             ::operator->(&local_30);
    SVar4 = LinearExpert<1,_1>::get_h(&pFVar3->super_LinearExpert<1,_1>);
    local_28 = SVar4 + local_28;
    __gnu_cxx::
    __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
    ::operator++((__normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
                  *)in_stack_fffffffffffffab8,(int)((ulong)in_stack_fffffffffffffab0 >> 0x20));
  }
  if ((local_28 != 0.0) || (NAN(local_28))) {
    if (((byte)*in_RDI & 1) == 0) {
      local_208._M_current =
           (FastLinearExpert<1,_1> *)
           std::
           vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
           ::begin((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                    *)in_stack_fffffffffffffaa8);
      while( true ) {
        local_210 = (FastLinearExpert<1,_1> *)
                    std::
                    vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                    ::end((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                           *)in_stack_fffffffffffffaa8);
        bVar1 = __gnu_cxx::operator<
                          ((__normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
                            *)in_stack_fffffffffffffab0,
                           (__normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
                            *)in_stack_fffffffffffffaa8);
        if (!bVar1) break;
        in_stack_fffffffffffffad8 =
             __gnu_cxx::
             __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
             ::operator->(&local_208);
        in_stack_fffffffffffffae0 = local_10;
        pFVar3 = __gnu_cxx::
                 __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
                 ::operator->(&local_208);
        LinearExpert<1,_1>::get_h(&pFVar3->super_LinearExpert<1,_1>);
        FastLinearExpert<1,_1>::e_step
                  (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                   in_stack_fffffffffffffc18);
        __gnu_cxx::
        __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
        ::operator->(&local_208);
        FastLinearExpert<1,_1>::m_step(in_stack_fffffffffffffee0);
        local_218 = (FastLinearExpert<1,_1> *)
                    __gnu_cxx::
                    __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
                    ::operator++((__normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
                                  *)in_stack_fffffffffffffab8,
                                 (int)((ulong)in_stack_fffffffffffffab0 >> 0x20));
      }
    }
    else {
      local_1f0[0]._M_current =
           (FastLinearExpert<1,_1> *)
           std::
           vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
           ::begin((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                    *)in_stack_fffffffffffffaa8);
      while( true ) {
        local_1f8 = (FastLinearExpert<1,_1> *)
                    std::
                    vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                    ::end((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                           *)in_stack_fffffffffffffaa8);
        bVar1 = __gnu_cxx::operator<
                          ((__normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
                            *)in_stack_fffffffffffffab0,
                           (__normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
                            *)in_stack_fffffffffffffaa8);
        if (!bVar1) break;
        pFVar3 = __gnu_cxx::
                 __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
                 ::operator->(local_1f0);
        SVar4 = LinearExpert<1,_1>::get_h(&pFVar3->super_LinearExpert<1,_1>);
        local_20 = SVar4 / local_28;
        if (0.001 < local_20) {
          __gnu_cxx::
          __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
          ::operator->(local_1f0);
          FastLinearExpert<1,_1>::e_step
                    (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                     in_stack_fffffffffffffc18);
          __gnu_cxx::
          __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
          ::operator->(local_1f0);
          FastLinearExpert<1,_1>::m_step(in_stack_fffffffffffffee0);
        }
        local_200 = (FastLinearExpert<1,_1> *)
                    __gnu_cxx::
                    __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
                    ::operator++((__normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
                                  *)in_stack_fffffffffffffab8,
                                 (int)((ulong)in_stack_fffffffffffffab0 >> 0x20));
      }
    }
  }
  else {
    in_stack_fffffffffffffaf0 = (StorageBaseType *)(in_RDI + 0x98);
    FastLinearExpert<1,_1>::FastLinearExpert
              (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
               in_stack_fffffffffffffc98);
    std::
    vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>::
    push_back(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    std::
    vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>::
    back(in_stack_fffffffffffffab0);
    FastLinearExpert<1,_1>::e_step
              (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
               in_stack_fffffffffffffc18);
    std::
    vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>::
    back(in_stack_fffffffffffffab0);
    FastLinearExpert<1,_1>::m_step(in_stack_fffffffffffffee0);
    sVar2 = std::
            vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
            ::size((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                    *)(in_RDI + 0x98));
    *(int *)(in_RDI + 0xb0) = (int)sVar2;
    this_00 = std::operator<<((ostream *)&std::cout,"e_step: sum_h = 0.0! (Should not happen)");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix
            ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffab0,
             (Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffaa8);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix
            ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffab0,
             (Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffaa8);
  local_230[0]._M_current =
       (FastLinearExpert<1,_1> *)
       std::
       vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
       ::begin((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                *)in_stack_fffffffffffffaa8);
  while( true ) {
    local_238 = (FastLinearExpert<1,_1> *)
                std::
                vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                ::end((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                       *)in_stack_fffffffffffffaa8);
    bVar1 = __gnu_cxx::operator<
                      ((__normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
                        *)in_stack_fffffffffffffab0,
                       (__normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
                        *)in_stack_fffffffffffffaa8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
    ::operator->(local_230);
    Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::diagonal
              ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffab8);
    Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffad0,
               in_stack_fffffffffffffac8);
    __gnu_cxx::
    __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
    ::operator->(local_230);
    Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffad0,
               (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffac8);
    local_250 = (FastLinearExpert<1,_1> *)
                __gnu_cxx::
                __normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
                ::operator++((__normal_iterator<FastLinearExpert<1,_1>_*,_std::vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>_>
                              *)in_stack_fffffffffffffab8,
                             (int)((ulong)in_stack_fffffffffffffab0 >> 0x20));
  }
  local_258 = ((double)*(int *)(in_RDI + 0xb0) * *(double *)(in_RDI + 0x30) +
              -*(double *)(in_RDI + 0x20)) / 2.0 - 1.0;
  local_288 = *(double *)(in_RDI + 0x30) * *(double *)(in_RDI + 0x20) * *(double *)(in_RDI + 0x18);
  Eigen::operator*((double *)in_RDI,in_stack_fffffffffffffaf0);
  Eigen::Matrix<double,1,1,0,1,1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffab0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
              *)in_stack_fffffffffffffaa8);
  local_290 = local_258 * local_258;
  local_298 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::array
                        (in_stack_fffffffffffffaa8);
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>::operator+=
            (in_stack_fffffffffffffae0,(Scalar *)in_stack_fffffffffffffad8);
  Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::array(in_stack_fffffffffffffaa8);
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>::sqrt(local_340,__x)
  ;
  Eigen::
  ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,1,1,0,1,1>>const>>
  ::operator+(in_RDI,(double *)in_stack_fffffffffffffaf0);
  this_01 = (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)(in_RDI + 0x30);
  Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::array(this_01);
  Eigen::operator*((double *)in_RDI,(StorageBaseType *)in_stack_fffffffffffffaf0);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,1,1,0,1,1>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,1,0,1,1>const>const>>
  ::operator/((ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_1,_0,_1,_1>_>_>_>
               *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::array(this_01);
  Eigen::ArrayWrapper<Eigen::Matrix<double,1,1,0,1,1>>::operator=
            ((ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffab0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_1,_0,_1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_1,_0,_1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>_>
              *)this_01);
  local_258 = ((double)*(int *)(in_RDI + 0xb0) * *(double *)(in_RDI + 0x48) +
              -*(double *)(in_RDI + 0x28)) / 2.0 - 1.0;
  local_3f0 = *(double *)(in_RDI + 0x48) * *(double *)(in_RDI + 0x28);
  local_3f8 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::array(this_01);
  Eigen::operator*((double *)in_RDI,(StorageBaseType *)in_stack_fffffffffffffaf0);
  local_400 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::array(this_01);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,1,0,1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,1,0,1,1>>const>>
  ::operator*((ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_1,_0,_1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
               *)in_stack_fffffffffffffad8,
              (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *)
              in_stack_fffffffffffffad0);
  local_408 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::array(this_01);
  Eigen::ArrayWrapper<Eigen::Matrix<double,1,1,0,1,1>>::operator=
            ((ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffab0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_1,_0,_1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
              *)this_01);
  local_410 = local_258 * local_258;
  local_418 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::array(this_01);
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>::operator+=
            (in_stack_fffffffffffffae0,(Scalar *)in_stack_fffffffffffffad8);
  Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::array(this_01);
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>::sqrt
            (local_4c0,__x_00);
  Eigen::
  ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,1,1,0,1,1>>const>>
  ::operator+(in_RDI,(double *)in_stack_fffffffffffffaf0);
  this_02 = (DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)(in_RDI + 0x48);
  Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::array(this_01);
  Eigen::operator*((double *)in_RDI,(StorageBaseType *)in_stack_fffffffffffffaf0);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,1,1,0,1,1>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,1,0,1,1>const>const>>
  ::operator/((ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_1,_0,_1,_1>_>_>_>
               *)in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::array(this_01);
  Eigen::ArrayWrapper<Eigen::Matrix<double,1,1,0,1,1>>::operator=
            ((ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)this_02,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_1,_0,_1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_1,_0,_1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>_>
              *)this_01);
  dVar8 = *(double *)(in_RDI + 0xf8);
  SVar5 = Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::prod(this_02);
  dVar6 = sqrt(SVar5);
  *(double *)(in_RDI + 0xe0) = dVar8 / dVar6;
  dVar8 = *(double *)(in_RDI + 0xf0);
  SVar5 = Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::prod(this_02);
  dVar6 = sqrt(SVar5);
  *(double *)(in_RDI + 0xd8) = dVar8 / dVar6;
  dVar8 = *(double *)(in_RDI + 0x100);
  SVar5 = Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::prod(this_02);
  SVar7 = Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::prod(this_02);
  dVar6 = sqrt(SVar5 * SVar7);
  *(double *)(in_RDI + 0xe8) = dVar8 / dVar6;
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::EM(Z const &z, X const &x)
{
    // Expectation Step
    Scal h, sum_h = 0.0;
    for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        sum_h += it->get_h();

    if( sum_h == 0.0)
    {
        // Create new linear expert
#ifdef IMLE_NO_TEMPLATES
        experts.push_back( Expert(d,D,z,x,this) );
#else
        experts.push_back( Expert(z,x,this) );
#endif
        experts.back().e_step(z,x,1.0);
        experts.back().m_step();
        M = experts.size();
        std::cout << "e_step: sum_h = 0.0! (Should not happen)" << std::endl;
    }
    else if( param.accelerated )
        for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        {
            if( (h = it->get_h()/sum_h) > 0.001 )
            {
                it->e_step( z, x, h );
                it->m_step();
            }

        }
    else
        for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        {
            it->e_step( z, x, it->get_h()/sum_h );
            it->m_step();
        }

    // Maximization Step
    //
    Z sum_diagSigma = zeroZ;
    X sum_diagPsi = zeroX;
    for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
    {
        sum_diagSigma += it->invSigma.diagonal();
        sum_diagPsi += it->invPsi;
    }

    // Update common inverse-Wishart prior on Sigma
    Scal tmp = (M*param.wSigma - param.wsigma)/2.0 - 1.0;
    Sigma = param.wSigma * param.wsigma * param.sigma0 * sum_diagSigma;
    Sigma.array() += tmp*tmp;
    Sigma.array() = (Sigma.array().sqrt() + tmp) / (param.wSigma * sum_diagSigma.array());

    // Update common inverse-gamma prior on Psi
    tmp = (M*param.wPsi - param.wpsi)/2.0 - 1.0;
    Psi.array() = (param.wPsi * param.wpsi) * param.Psi0.array() * sum_diagPsi.array();
    Psi.array() += tmp*tmp;
    Psi.array() = (Psi.array().sqrt() + tmp) / (param.wPsi * sum_diagPsi.array());

    // Update outlier model
    pNoiseModelX = sig_level_noiseX_rbf / sqrt(Psi.prod());
    pNoiseModelZ = sig_level_noiseZ_rbf / sqrt(Sigma.prod());
    pNoiseModelZX = sig_level_noiseZX_rbf / sqrt(Psi.prod() * Sigma.prod());
}